

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O2

ssize_t extract_pack_stream(archive_read *a,size_t minimum)

{
  byte bVar1;
  _7zip *zip;
  uchar *puVar2;
  size_t sVar3;
  unsigned_long uVar4;
  uint64_t uVar5;
  Bool BVar6;
  uint32_t uVar7;
  uchar *puVar8;
  uint8_t *__src;
  uint64_t uVar9;
  uchar *puVar10;
  ssize_t sVar11;
  undefined8 uVar12;
  void *pvVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  uint8_t *limit;
  size_t sVar17;
  char *pcVar18;
  byte bVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  uchar *outBuf;
  uchar *__dest;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  size_t outSize;
  ulong uVar31;
  size_t sVar32;
  bool bVar33;
  ulong local_f0;
  uint local_d8;
  ulong local_b0;
  ulong local_a8;
  uchar *local_a0;
  code *local_98;
  IByteIn *local_90;
  size_t local_88;
  z_stream *local_80;
  size_t local_78;
  CPpmd7 *local_70;
  code *local_68;
  uchar *local_60;
  ulong local_58;
  long local_50;
  ZSTD_inBuffer input;
  
  zip = (_7zip *)a->format->data;
  if ((zip->codec == 0) && (zip->codec2 == 0xffffffffffffffff)) {
    pvVar13 = __archive_read_ahead(a,minimum + (minimum == 0),(ssize_t *)&local_b0);
    if (0 < (long)local_b0 && pvVar13 != (void *)0x0) {
      uVar31 = zip->folder_outbytes_remaining;
      uVar16 = zip->pack_stream_inbytes_remaining;
      if (uVar16 <= local_b0) {
        local_b0 = uVar16;
      }
      zip->pack_stream_inbytes_remaining = uVar16 - local_b0;
      if (uVar31 <= local_b0) {
        local_b0 = uVar31;
      }
      zip->folder_outbytes_remaining = uVar31 - local_b0;
      zip->uncompressed_buffer_bytes_remaining = local_b0;
      return 0;
    }
    pcVar18 = "Truncated 7-Zip file body";
    iVar22 = 0x54;
LAB_0022bc87:
    archive_set_error(&a->archive,iVar22,pcVar18);
  }
  else {
    puVar8 = zip->uncompressed_buffer;
    if (puVar8 == (uchar *)0x0) {
      sVar17 = 0x10000;
      if (0x10000 < minimum) {
        sVar17 = minimum + 0x3ff & 0xfffffffffffffc00;
      }
      zip->uncompressed_buffer_size = sVar17;
      puVar8 = (uchar *)malloc(sVar17);
      zip->uncompressed_buffer = puVar8;
      if (puVar8 == (uchar *)0x0) {
LAB_0022bc42:
        pcVar18 = "No memory for 7-Zip decompression";
        iVar22 = 0xc;
        goto LAB_0022bc87;
      }
LAB_0022b034:
      zip->uncompressed_buffer_bytes_remaining = 0;
    }
    else {
      if ((minimum <= zip->uncompressed_buffer_size) &&
         (minimum <= zip->uncompressed_buffer_bytes_remaining)) goto LAB_0022b034;
      lVar24 = (long)zip->uncompressed_buffer_pointer - (long)puVar8;
      if (zip->uncompressed_buffer_pointer == (uchar *)0x0) {
        lVar24 = 0;
      }
      if (zip->uncompressed_buffer_size < minimum) {
        uVar31 = minimum + 0x3ff & 0xfffffffffffffc00;
        puVar8 = (uchar *)realloc(puVar8,uVar31);
        if (puVar8 == (uchar *)0x0) goto LAB_0022bc42;
        zip->uncompressed_buffer = puVar8;
        zip->uncompressed_buffer_size = uVar31;
      }
      if (lVar24 != 0) {
        memmove(puVar8,puVar8 + lVar24,zip->uncompressed_buffer_bytes_remaining);
      }
    }
    zip->uncompressed_buffer_pointer = (uchar *)0x0;
    local_a0 = zip->odd_bcj;
    local_90 = &zip->bytein;
    local_98 = Ppmd7z_RangeDec_Init;
    local_68 = Ppmd7_DecodeSymbol;
    local_70 = &zip->ppmd7_context;
    local_80 = &zip->stream;
    local_88 = minimum;
    while (__src = (uint8_t *)__archive_read_ahead(a,1,(ssize_t *)&local_b0), 0 < (long)local_b0) {
      puVar2 = zip->uncompressed_buffer;
      sVar3 = zip->uncompressed_buffer_bytes_remaining;
      puVar8 = puVar2 + sVar3;
      uVar30 = zip->uncompressed_buffer_size - sVar3;
      uVar31 = zip->pack_stream_inbytes_remaining;
      uVar16 = local_b0;
      if (uVar31 <= local_b0) {
        uVar16 = uVar31;
      }
      puVar10 = (uchar *)zip->codec2;
      sVar14 = uVar30;
      outBuf = puVar8;
      if (puVar10 != buff + 0x55cb83 || zip->codec == 0x21) {
LAB_0022b1bf:
        outSize = sVar14;
        __dest = outBuf;
        if (puVar10 == buff + 0x55cb9b) {
          sVar32 = zip->tmp_stream_bytes_remaining;
          if (sVar32 != 0) {
            sVar11 = Bcj2_Decode(zip,outBuf,sVar14);
            if (sVar11 < 0) {
              pcVar18 = "BCJ2 conversion Failed";
              iVar22 = -1;
              goto LAB_0022bd35;
            }
            zip->main_stream_bytes_remaining =
                 zip->main_stream_bytes_remaining + (zip->tmp_stream_bytes_remaining - sVar32);
            outSize = sVar14 - sVar11;
            if ((uVar31 == 0) || (outSize == 0)) {
              uVar27 = uVar30 - outSize;
              local_d8 = 0;
              if (uVar31 == 0) {
                local_d8 = (uint)(zip->tmp_stream_bytes_remaining != 0);
              }
              uVar9 = 0;
              goto LAB_0022bb99;
            }
            outBuf = outBuf + sVar11;
          }
          sVar14 = zip->tmp_stream_buff_size;
          __dest = zip->tmp_stream_buff;
        }
        uVar4 = zip->codec;
        if (uVar4 == 0x4f71101) {
          input.pos = 0;
          local_50 = 0;
          local_60 = __dest;
          local_58 = sVar14;
          input.src = __src;
          input.size = uVar16;
          uVar12 = ZSTD_decompressStream(zip->zstd_dstream,&local_60,&input);
          iVar22 = ZSTD_isError();
          if (iVar22 != 0) {
            uVar12 = ZSTD_getErrorName(uVar12);
            archive_set_error(&a->archive,-1,"Zstd decompression failed: %s",uVar12);
            return -0x1e;
          }
          sVar32 = uVar16 - input.pos;
          sVar14 = sVar14 - local_50;
          uVar15 = 0;
LAB_0022b42a:
          uVar27 = uVar30 - sVar14;
          local_d8 = (uint)uVar15;
          local_78 = sVar14;
          if (zip->codec == 0x21) {
LAB_0022bb0f:
            puVar10 = (uchar *)zip->codec2;
          }
          else {
            puVar10 = (uchar *)zip->codec2;
            lVar24 = sVar3 + 3;
            if (puVar10 == buff + 0x55d285) {
              iVar22 = 0;
              for (uVar31 = 0; uVar31 < (uVar27 & 0xfffffffffffffffc); uVar31 = uVar31 + 4) {
                uVar20 = (uint)puVar2[uVar31 + sVar3 + 1] * 0x10000 +
                         (uint)puVar2[uVar31 + sVar3] * 0x1000000 >> 0x16;
                if ((uVar20 == 0x1ff) || (uVar20 == 0x100)) {
                  uVar20 = (((uint)puVar2[uVar31 + sVar3] * 0x1000000 +
                             (uint)puVar2[uVar31 + sVar3 + 1] * 0x10000 +
                            (uint)puVar2[uVar31 + lVar24] + (uint)puVar2[uVar31 + sVar3 + 2] * 0x100
                            ) * 4 - zip->bcj_ip) + iVar22;
                  uVar21 = uVar20 >> 2;
                  iVar23 = 0x40000000 - (uVar21 & 0x400000);
                  puVar2[uVar31 + sVar3] = (byte)((uint)iVar23 >> 0x18) | 0x40;
                  puVar2[uVar31 + sVar3 + 1] =
                       (byte)(uVar21 >> 0x10) & 0x3f | (byte)((uint)iVar23 >> 0x10);
                  puVar2[uVar31 + sVar3 + 2] = (uchar)(uVar20 >> 10);
                  puVar2[uVar31 + lVar24] = (uchar)uVar21;
                }
                iVar22 = iVar22 + -4;
              }
LAB_0022b860:
              zip->bcj_ip = zip->bcj_ip + (int)uVar31;
              uVar27 = uVar31;
              goto LAB_0022bb0f;
            }
            if (puVar10 == buff + 0x55cb83) {
              if (uVar27 < 5) {
                uVar25 = 0;
              }
              else {
                local_f0 = (ulong)zip->bcj_prevMask;
                iVar22 = -zip->bcj_ip;
                bVar19 = -(char)zip->bcj_ip;
                uVar15 = 0;
                uVar26 = zip->bcj_prevPosT;
                while( true ) {
                  uVar25 = uVar15;
                  iVar23 = (int)uVar25;
                  uVar7 = (uint32_t)local_f0;
                  if (puVar8 + (uVar27 - 4) <= puVar8 + uVar25) break;
                  if ((puVar8[uVar25] & 0xfe) == 0xe8) {
                    local_f0 = 0;
                    if (uVar25 - uVar26 < 4) {
                      uVar20 = uVar7 << (~(byte)uVar26 + (char)uVar25 & 0x1f) & 7;
                      if ((uVar20 == 0) ||
                         (((0xe8U >> uVar20 & 1) == 0 &&
                          (local_f0 = (ulong)uVar20,
                          (byte)(puVar8[uVar25 + (4 - (ulong)*(byte *)((long)&
                                                  x86_Convert_kMaskToBitNumber + (ulong)uVar20))] -
                                1) < 0xfe)))) goto LAB_0022b9b8;
LAB_0022ba9d:
                      local_f0 = (ulong)((uVar20 & 3) * 2 + 1);
                      lVar24 = 1;
                    }
                    else {
LAB_0022b9b8:
                      bVar1 = puVar8[uVar25 + 4];
                      uVar20 = (uint)local_f0;
                      if ((bVar1 != 0xff) && (bVar1 != 0)) goto LAB_0022ba9d;
                      uVar21 = (uint)puVar8[uVar25 + 1] |
                               (uint)puVar8[uVar25 + 2] << 8 |
                               (uint)puVar8[uVar25 + 3] << 0x10 | (uint)bVar1 << 0x18;
                      while (uVar20 != 0) {
                        uVar29 = uVar21 + (iVar22 - iVar23);
                        uVar28 = uVar29 >> (*(char *)((long)&x86_Convert_kMaskToBitNumber + local_f0
                                                     ) * -8 + 0x18U & 0x1f);
                        if (((char)uVar28 != -1) && ((uVar28 & 0xff) != 0)) break;
                        uVar21 = ~(uVar29 ^ -1 << (*(char *)((long)&x86_Convert_kMaskToBitNumber +
                                                            local_f0) * -8 & 0x1fU));
                      }
                      iVar23 = (iVar22 + uVar21) - iVar23;
                      puVar8[uVar25 + 4] = (uchar)(iVar23 * 0x80 >> 0x1f);
                      puVar8[uVar25 + 3] = (uchar)((uint)iVar23 >> 0x10);
                      puVar8[uVar25 + 2] = (uchar)((uint)iVar23 >> 8);
                      puVar8[uVar25 + 1] = ((char)uVar21 + bVar19) - (char)uVar25;
                      lVar24 = 5;
                      local_a8 = (ulong)bVar19;
                    }
                    uVar15 = lVar24 + uVar25;
                    uVar26 = uVar25;
                  }
                  else {
                    uVar15 = uVar25 + 1;
                  }
                }
                zip->bcj_prevPosT = uVar26;
                zip->bcj_prevMask = uVar7;
                zip->bcj_ip = zip->bcj_ip + iVar23;
              }
              sVar17 = uVar27 - uVar25;
              zip->odd_bcj_size = sVar17;
              if ((((sVar17 == 0) || (local_d8 == 1)) || (4 < sVar17)) || (uVar31 == 0)) {
                zip->odd_bcj_size = 0;
              }
              else {
                memcpy(local_a0,puVar8 + uVar25,sVar17);
                uVar27 = uVar25;
              }
              goto LAB_0022bb0f;
            }
            if (puVar10 == buff + 0x55cc85) {
              iVar22 = 0;
              for (uVar31 = 0; uVar31 < (uVar27 & 0xfffffffffffffffc); uVar31 = uVar31 + 4) {
                if ((puVar2[uVar31 + sVar3] & 0xfc) == 0x48) {
                  bVar19 = puVar2[uVar31 + lVar24];
                  if ((bVar19 & 3) == 1) {
                    uVar7 = zip->bcj_ip;
                    iVar23 = ((bVar19 & 0xfffffffc |
                              (uint)puVar2[uVar31 + sVar3 + 2] << 8 |
                              (uint)puVar2[uVar31 + sVar3 + 1] << 0x10 |
                              (puVar2[uVar31 + sVar3] & 3) << 0x18) - uVar7) + iVar22;
                    puVar2[uVar31 + sVar3] = (byte)((uint)iVar23 >> 0x18) & 3 | 0x48;
                    puVar2[uVar31 + sVar3 + 1] = (uchar)((uint)iVar23 >> 0x10);
                    puVar2[uVar31 + sVar3 + 2] = (uchar)((uint)iVar23 >> 8);
                    puVar2[uVar31 + lVar24] =
                         ((bVar19 & 0xfc) - (char)uVar7) + (char)iVar22 | bVar19 & 3;
                  }
                }
                iVar22 = iVar22 + -4;
              }
              goto LAB_0022b860;
            }
            if (puVar10 == buff + 0x55cf81) {
              lVar24 = 0;
              for (uVar31 = 4; uVar31 <= uVar27; uVar31 = uVar31 + 4) {
                if (puVar8[uVar31 - 1] == 0xeb) {
                  uVar20 = ((((uint)puVar8[uVar31 - 3] << 10 | (uint)puVar8[uVar31 - 2] << 0x12) +
                            (uint)puVar8[uVar31 - 4] * 4) - zip->bcj_ip) + (int)lVar24;
                  puVar8[uVar31 - 4] = (uchar)(uVar20 >> 2);
                  puVar8[uVar31 - 3] = (uchar)(uVar20 >> 10);
                  puVar8[uVar31 - 2] = (uchar)(uVar20 >> 0x12);
                }
                lVar24 = lVar24 + -4;
              }
              zip->bcj_ip = zip->bcj_ip - (int)lVar24;
              uVar27 = -lVar24;
              goto LAB_0022bb0f;
            }
            if (puVar10 == (uchar *)0xa) {
              uVar15 = 0;
LAB_0022b4b6:
              uVar31 = uVar15;
              uVar15 = uVar31 + 4;
              if (uVar15 <= uVar27) {
                bVar19 = puVar2[uVar31 + sVar3];
                uVar20 = (uint)puVar2[uVar31 + sVar3 + 2] << 0x10 |
                         (uint)puVar2[uVar31 + sVar3 + 1] << 8;
                uVar21 = uVar20 | bVar19;
                bVar1 = puVar2[uVar31 + lVar24];
                if ((bVar1 & 0xfc) != 0x94) goto LAB_0022b525;
                iVar22 = (uVar21 | (uint)bVar1 << 0x18) - (zip->bcj_ip + (int)uVar31 >> 2);
                puVar2[uVar31 + sVar3] = (uchar)iVar22;
                puVar2[uVar31 + sVar3 + 1] = (uchar)((uint)iVar22 >> 8);
                puVar2[uVar31 + sVar3 + 2] = (uchar)((uint)iVar22 >> 0x10);
                bVar19 = (byte)((uint)iVar22 >> 0x18) & 3 | 0x94;
                goto LAB_0022b520;
              }
              goto LAB_0022b860;
            }
          }
          if (puVar10 == buff + 0x55cb9b) {
            uVar31 = zip->tmp_stream_buff_size - local_78;
            if (zip->main_stream_bytes_remaining <= uVar31) {
              uVar31 = zip->main_stream_bytes_remaining;
            }
            zip->tmp_stream_bytes_avail = uVar31;
            zip->tmp_stream_bytes_remaining = uVar31;
            sVar11 = Bcj2_Decode(zip,outBuf,outSize);
            if (sVar11 < 0) {
              pcVar18 = "BCJ2 conversion Failed";
              goto LAB_0022bc3e;
            }
            zip->main_stream_bytes_remaining =
                 zip->main_stream_bytes_remaining +
                 (zip->tmp_stream_bytes_remaining - zip->tmp_stream_bytes_avail);
            uVar27 = (uVar30 - outSize) + sVar11;
          }
          if (1 < local_d8) {
            return -0x1e;
          }
          uVar9 = uVar16 - sVar32;
          goto LAB_0022bb99;
        }
        if ((uVar4 == 0x21) || (uVar4 == 0x30101)) {
          (zip->lzstream).next_in = __src;
          (zip->lzstream).avail_in = uVar16;
          (zip->lzstream).next_out = __dest;
          (zip->lzstream).avail_out = sVar14;
          uVar20 = lzma_code(&zip->lzstream,0);
          uVar15 = (ulong)uVar20;
          if (uVar20 != 0) {
            if (uVar20 != 1) {
              pcVar18 = "Decompression failed(%d)";
LAB_0022bd65:
              archive_set_error(&a->archive,-1,pcVar18);
              return -0x1e;
            }
            lzma_end();
            zip->lzstream_valid = 0;
          }
          sVar32 = (zip->lzstream).avail_in;
          sVar14 = (zip->lzstream).avail_out;
          goto LAB_0022b42a;
        }
        if (uVar4 != 0x30401) {
          if (uVar4 == 0x40108) {
            (zip->stream).next_in = __src;
            (zip->stream).avail_in = (uInt)uVar16;
            (zip->stream).next_out = __dest;
            (zip->stream).avail_out = (uInt)sVar14;
            uVar20 = inflate(local_80,0);
            uVar15 = (ulong)uVar20;
            if (1 < uVar20) {
              pcVar18 = "File decompression failed (%d)";
              goto LAB_0022bd65;
            }
            sVar32 = (size_t)(zip->stream).avail_in;
            sVar14 = (size_t)(zip->stream).avail_out;
          }
          else {
            if (uVar4 != 0) goto LAB_0022bd0f;
            uVar27 = sVar14;
            if (uVar16 < sVar14) {
              uVar27 = uVar16;
            }
            memcpy(__dest,__src,uVar27);
            sVar32 = uVar16 - uVar27;
            sVar14 = sVar14 - uVar27;
            uVar15 = (ulong)(uVar31 == 0);
          }
          goto LAB_0022b42a;
        }
        if (((zip->ppmd7_valid != 0) && (iVar22 = zip->ppmd7_stat, -1 < iVar22)) && (sVar14 != 0)) {
          (zip->ppstream).next_in = __src;
          (zip->ppstream).avail_in = uVar16;
          (zip->ppstream).stream_in = 0;
          (zip->ppstream).next_out = __dest;
          (zip->ppstream).avail_out = sVar14;
          if (iVar22 == 0) {
            (zip->bytein).a = a;
            (zip->bytein).Read = ppmd_read;
            (zip->range_dec).Stream = local_90;
            BVar6 = (*local_98)(&zip->range_dec);
            if (BVar6 == 0) {
              zip->ppmd7_stat = -1;
              pcVar18 = "Failed to initialize PPMd range decoder";
              goto LAB_0022bc3e;
            }
            if ((zip->ppstream).overconsumed != 0) {
LAB_0022bcf2:
              zip->ppmd7_stat = -1;
              return -0x1e;
            }
            zip->ppmd7_stat = 1;
          }
          if (uVar31 == 0) {
            uVar27 = zip->folder_outbytes_remaining;
          }
          else {
            uVar27 = 0;
          }
          do {
            uVar26 = uVar27;
            iVar22 = (*local_68)(local_70,&(zip->range_dec).p);
            if (iVar22 < 0) {
              zip->ppmd7_stat = -1;
              pcVar18 = "Failed to decode PPMd";
              iVar22 = 0x54;
              goto LAB_0022bd35;
            }
            if ((zip->ppstream).overconsumed != 0) goto LAB_0022bcf2;
            puVar10 = (zip->ppstream).next_out;
            (zip->ppstream).next_out = puVar10 + 1;
            *puVar10 = (uchar)iVar22;
            sVar14 = (zip->ppstream).avail_out - 1;
            (zip->ppstream).avail_out = sVar14;
            (zip->ppstream).total_out = (zip->ppstream).total_out + 1;
            sVar32 = (zip->ppstream).avail_in;
            uVar15 = 0;
            if (sVar14 == 0) {
              sVar14 = 0;
              break;
            }
            uVar27 = uVar26 - 1;
            if (uVar26 == 0) {
              uVar27 = uVar15;
            }
          } while ((sVar32 != 0) || (sVar32 = 0, 1 < uVar26));
          goto LAB_0022b42a;
        }
LAB_0022bd0f:
        pcVar18 = "Decompression internal error";
LAB_0022bc3e:
        iVar22 = -1;
        goto LAB_0022bd35;
      }
      sVar14 = zip->odd_bcj_size;
      if (uVar30 < 5 && uVar31 != 0) {
        local_d8 = 0;
        uVar27 = 0;
        uVar9 = 0;
        bVar33 = sVar14 == 0;
        sVar14 = 0;
        if (bVar33) goto LAB_0022b164;
      }
      else {
LAB_0022b164:
        for (uVar27 = 0; (sVar14 != 0 && (uVar30 != uVar27)); uVar27 = uVar27 + 1) {
          puVar8[uVar27] = zip->odd_bcj[uVar27];
          sVar14 = zip->odd_bcj_size - 1;
          zip->odd_bcj_size = sVar14;
        }
        sVar14 = uVar30 - uVar27;
        if (sVar14 != 0 && uVar31 != 0) {
          outBuf = puVar8 + uVar27;
          puVar10 = (uchar *)zip->codec2;
          goto LAB_0022b1bf;
        }
        local_d8 = (uint)(uVar31 == 0);
        uVar9 = 0;
      }
LAB_0022bb99:
      uVar5 = zip->pack_stream_inbytes_remaining;
      zip->pack_stream_inbytes_remaining = uVar5 - uVar9;
      uVar31 = zip->folder_outbytes_remaining;
      uVar16 = uVar31;
      if (uVar27 < uVar31) {
        uVar16 = uVar27;
      }
      zip->folder_outbytes_remaining = uVar31 - uVar16;
      uVar30 = zip->uncompressed_buffer_bytes_remaining + uVar16;
      zip->uncompressed_buffer_bytes_remaining = uVar30;
      zip->pack_stream_bytes_unconsumed = uVar9;
      if ((uVar30 == zip->uncompressed_buffer_size) ||
         (((((uchar *)zip->codec2 == buff + 0x55cb83 && (zip->uncompressed_buffer_size < uVar30 + 5)
            ) && (zip->odd_bcj_size != 0)) || ((uVar5 == uVar9 && (uVar31 <= uVar27)))))) {
        if (local_88 <= uVar30) {
          zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
          return 0;
        }
LAB_0022bc37:
        pcVar18 = "Damaged 7-Zip archive";
        goto LAB_0022bc3e;
      }
      if ((local_d8 != 0) || (uVar16 == 0 && uVar9 == 0)) goto LAB_0022bc37;
      read_consume(a);
    }
    pcVar18 = "Truncated 7-Zip file body";
    iVar22 = 0x54;
LAB_0022bd35:
    archive_set_error(&a->archive,iVar22,pcVar18);
  }
  return -0x1e;
LAB_0022b525:
  if (((bVar1 & 0x9f) == 0x90) && (((uVar21 >> 3) + 0x20000 & 0x1c0000) == 0)) {
    uVar20 = (bVar1 >> 5 & 3 | (uVar20 | bVar19 & 0xffffffe0) >> 3) -
             (zip->bcj_ip + (int)uVar31 >> 0xc);
    uVar21 = uVar20 * 8 & 0x1fffe0;
    puVar2[uVar31 + sVar3] = bVar19 & 0x1f | (byte)uVar21;
    puVar2[uVar31 + sVar3 + 1] = (uchar)(uVar20 >> 5);
    puVar2[uVar31 + sVar3 + 2] = (byte)(-(uVar20 & 0x20000) >> 0x10) & 0xe0 | (byte)(uVar21 >> 0x10)
    ;
    bVar19 = (char)uVar20 << 5 | 0x90;
LAB_0022b520:
    puVar2[uVar31 + lVar24] = bVar19;
  }
  goto LAB_0022b4b6;
}

Assistant:

static ssize_t
extract_pack_stream(struct archive_read *a, size_t minimum)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	ssize_t bytes_avail;
	int r;

	if (zip->codec == _7Z_COPY && zip->codec2 == (unsigned long)-1) {
		if (minimum == 0)
			minimum = 1;
		if (__archive_read_ahead(a, minimum, &bytes_avail) == NULL
		    || bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}
		if ((uint64_t)bytes_avail > zip->pack_stream_inbytes_remaining)
			bytes_avail = (ssize_t)zip->pack_stream_inbytes_remaining;
		zip->pack_stream_inbytes_remaining -= bytes_avail;
		if ((uint64_t)bytes_avail > zip->folder_outbytes_remaining)
			bytes_avail = (ssize_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_avail;
		zip->uncompressed_buffer_bytes_remaining = bytes_avail;
		return (ARCHIVE_OK);
	}

	/* If the buffer hasn't been allocated, allocate it now. */
	if (zip->uncompressed_buffer == NULL) {
		zip->uncompressed_buffer_size = UBUFF_SIZE;
		if (zip->uncompressed_buffer_size < minimum) {
			zip->uncompressed_buffer_size = minimum + 1023;
			zip->uncompressed_buffer_size &= ~0x3ff;
		}
		zip->uncompressed_buffer =
		    malloc(zip->uncompressed_buffer_size);
		if (zip->uncompressed_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for 7-Zip decompression");
			return (ARCHIVE_FATAL);
		}
		zip->uncompressed_buffer_bytes_remaining = 0;
	} else if (zip->uncompressed_buffer_size < minimum ||
	    zip->uncompressed_buffer_bytes_remaining < minimum) {
		/*
		 * Make sure the uncompressed buffer can have bytes
		 * at least `minimum' bytes.
		 * NOTE: This case happen when reading the header.
		 */
		size_t used;
		if (zip->uncompressed_buffer_pointer != 0)
			used = zip->uncompressed_buffer_pointer -
				zip->uncompressed_buffer;
		else
			used = 0;
		if (zip->uncompressed_buffer_size < minimum) {
			/*
			 * Expand the uncompressed buffer up to
			 * the minimum size.
			 */
			void *p;
			size_t new_size;

			new_size = minimum + 1023;
			new_size &= ~0x3ff;
			p = realloc(zip->uncompressed_buffer, new_size);
			if (p == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for 7-Zip decompression");
				return (ARCHIVE_FATAL);
			}
			zip->uncompressed_buffer = (unsigned char *)p;
			zip->uncompressed_buffer_size = new_size;
		}
		/*
		 * Move unconsumed bytes to the head.
		 */
		if (used) {
			memmove(zip->uncompressed_buffer,
				zip->uncompressed_buffer + used,
				zip->uncompressed_buffer_bytes_remaining);
		}
	} else
		zip->uncompressed_buffer_bytes_remaining = 0;
	zip->uncompressed_buffer_pointer = NULL;
	for (;;) {
		size_t bytes_in, bytes_out;
		const void *buff_in;
		unsigned char *buff_out;
		int end_of_data;

		/*
		 * Note: '1' here is a performance optimization.
		 * Recall that the decompression layer returns a count of
		 * available bytes; asking for more than that forces the
		 * decompressor to combine reads by copying data.
		 */
		buff_in = __archive_read_ahead(a, 1, &bytes_avail);
		if (bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}

		buff_out = zip->uncompressed_buffer
			+ zip->uncompressed_buffer_bytes_remaining;
		bytes_out = zip->uncompressed_buffer_size
			- zip->uncompressed_buffer_bytes_remaining;
		bytes_in = bytes_avail;
		if (bytes_in > zip->pack_stream_inbytes_remaining)
			bytes_in = (size_t)zip->pack_stream_inbytes_remaining;
		/* Drive decompression. */
		r = decompress(a, zip, buff_out, &bytes_out,
			buff_in, &bytes_in);
		switch (r) {
		case ARCHIVE_OK:
			end_of_data = 0;
			break;
		case ARCHIVE_EOF:
			end_of_data = 1;
			break;
		default:
			return (ARCHIVE_FATAL);
		}
		zip->pack_stream_inbytes_remaining -= bytes_in;
		if (bytes_out > zip->folder_outbytes_remaining)
			bytes_out = (size_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_out;
		zip->uncompressed_buffer_bytes_remaining += bytes_out;
		zip->pack_stream_bytes_unconsumed = bytes_in;

		/*
		 * Continue decompression until uncompressed_buffer is full.
		 */
		if (zip->uncompressed_buffer_bytes_remaining ==
		    zip->uncompressed_buffer_size)
			break;
		if (zip->codec2 == _7Z_X86 && zip->odd_bcj_size &&
		    zip->uncompressed_buffer_bytes_remaining + 5 >
		    zip->uncompressed_buffer_size)
			break;
		if (zip->pack_stream_inbytes_remaining == 0 &&
		    zip->folder_outbytes_remaining == 0)
			break;
		if (end_of_data || (bytes_in == 0 && bytes_out == 0)) {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
			return (ARCHIVE_FATAL);
		}
		read_consume(a);
	}
	if (zip->uncompressed_buffer_bytes_remaining < minimum) {
		archive_set_error(&(a->archive),
		    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
		return (ARCHIVE_FATAL);
	}
	zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
	return (ARCHIVE_OK);
}